

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::Reader::readNumber(Reader *this)

{
  bool bVar1;
  Reader *this_local;
  
  while ((this->current_ != this->end_ &&
         ((('/' < *this->current_ && (*this->current_ < ':')) ||
          (bVar1 = in(*this->current_,'.','e','E','+','-'), bVar1))))) {
    this->current_ = this->current_ + 1;
  }
  return;
}

Assistant:

void 
Reader::readNumber()
{
   while ( current_ != end_ )
   {
      if ( !(*current_ >= '0'  &&  *current_ <= '9')  &&
           !in( *current_, '.', 'e', 'E', '+', '-' ) )
         break;
      ++current_;
   }
}